

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O1

void __thiscall
Assimp::glTFImporter::InternReadFile
          (glTFImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer puVar1;
  pointer piVar2;
  int iVar3;
  Asset asset;
  string local_7b0;
  Asset local_790;
  
  puVar1 = (this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  piVar2 = (this->embeddedTexIdxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->embeddedTexIdxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->embeddedTexIdxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  this->mScene = pScene;
  glTF::Asset::Asset(&local_790,pIOHandler);
  BaseImporter::GetExtension(&local_7b0,pFile);
  iVar3 = std::__cxx11::string::compare((char *)&local_7b0);
  glTF::Asset::Load(&local_790,pFile,iVar3 == 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
  }
  ImportEmbeddedTextures(this,&local_790);
  ImportMaterials(this,&local_790);
  ImportMeshes(this,&local_790);
  ImportCameras(this,&local_790);
  ImportLights(this,&local_790);
  ImportNodes(this,&local_790);
  ImportCommonMetadata(this,&local_790);
  if (pScene->mNumMeshes == 0) {
    *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
  }
  glTF::Asset::~Asset(&local_790);
  return;
}

Assistant:

void glTFImporter::InternReadFile(const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    // clean all member arrays
    meshOffsets.clear();
    embeddedTexIdxs.clear();

    this->mScene = pScene;

    // read the asset file
    glTF::Asset asset(pIOHandler);
    asset.Load(pFile, GetExtension(pFile) == "glb");


    //
    // Copy the data out
    //

    ImportEmbeddedTextures(asset);
    ImportMaterials(asset);

    ImportMeshes(asset);

    ImportCameras(asset);
    ImportLights(asset);

    ImportNodes(asset);
    ImportCommonMetadata(asset);

    if (pScene->mNumMeshes == 0) {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }
}